

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall cmCommandArgument::ApplyOwnGroup(cmCommandArgument *this)

{
  cmCommandArgumentGroup *this_00;
  bool bVar1;
  reference ppcVar2;
  cmCommandArgument *local_30;
  cmCommandArgument *cargs;
  iterator __end2;
  iterator __begin2;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range2;
  cmCommandArgument *this_local;
  
  if (this->Group != (cmCommandArgumentGroup *)0x0) {
    this_00 = this->Group;
    __end2 = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                       (&this_00->ContainedArguments);
    cargs = (cmCommandArgument *)
            std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                      (&this_00->ContainedArguments);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                                       *)&cargs), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                ::operator*(&__end2);
      local_30 = *ppcVar2;
      if (local_30 != this) {
        std::
        set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
        ::insert(&this->ArgumentsBefore,&local_30);
      }
      __gnu_cxx::
      __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmCommandArgument::ApplyOwnGroup()
{
  if (this->Group != nullptr) {
    for (cmCommandArgument* cargs : this->Group->ContainedArguments) {
      if (cargs != this) {
        this->ArgumentsBefore.insert(cargs);
      }
    }
  }
}